

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  ushort uVar1;
  AddState *pAVar2;
  IndexValue *pIVar3;
  Inst *pIVar4;
  char **ppcVar5;
  Thread *pTVar6;
  uint32_t uVar7;
  Thread *pTVar8;
  char **ppcVar9;
  ostream *poVar10;
  int iVar11;
  Thread **ppTVar12;
  uint uVar13;
  ulong uVar14;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false> i
  ;
  uint uVar15;
  ulong local_1f0;
  LogMessage local_1b0;
  
  if (id0 == 0) {
    return;
  }
  pAVar2 = (this->stack_).ptr_._M_t.
           super___uniq_ptr_impl<re2::NFA::AddState,_re2::PODArray<re2::NFA::AddState>::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_re2::NFA::AddState_*,_re2::PODArray<re2::NFA::AddState>::Deleter>.
           super__Head_base<0UL,_re2::NFA::AddState_*,_false>._M_head_impl;
  pAVar2->id = id0;
  pAVar2->t = (Thread *)0x0;
  local_1f0 = 1;
LAB_001cac76:
  local_1f0 = (ulong)((int)local_1f0 - 1);
  i._M_head_impl.len_ = (Deleter)pAVar2[local_1f0].id;
  pTVar8 = pAVar2[local_1f0].t;
LAB_001cac8f:
  pTVar6 = t0;
  if (((pTVar8 != (Thread *)0x0) && (pTVar6 = pTVar8, t0 != (Thread *)0x0)) &&
     (iVar11 = (t0->field_0).ref, (t0->field_0).ref = iVar11 + -1, iVar11 < 2)) {
    t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->free_threads_;
    this->free_threads_ = t0;
  }
  t0 = pTVar6;
  if (i._M_head_impl.len_ == 0) goto switchD_001cad49_caseD_7;
  pIVar3 = (q->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
           _M_head_impl;
  if (((pIVar3 != (IndexValue *)0x0) &&
      ((uint)i._M_head_impl.len_ <
       (uint)*(int *)&(q->dense_).ptr_._M_t.
                      super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
                      .
                      super__Head_base<1UL,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
      )) && ((uVar15 = (q->sparse_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_],
             uVar15 < (uint)q->size_ && ((Deleter)pIVar3[(int)uVar15].index_ == i._M_head_impl.len_)
             ))) goto switchD_001cad49_caseD_7;
  local_1b0.flushed_ = false;
  local_1b0._1_7_ = 0;
  SparseArray<re2::NFA::Thread_*>::SetInternal
            (q,false,(int)i._M_head_impl.len_,(Thread **)&local_1b0);
  ppTVar12 = &(q->dense_).ptr_._M_t.
              super___uniq_ptr_impl<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_re2::PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::Deleter>
              .super__Head_base<0UL,_re2::SparseArray<re2::NFA::Thread_*>::IndexValue_*,_false>.
              _M_head_impl
              [(q->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_]].value_;
  pIVar4 = ((_Head_base<0UL,_re2::Prog::Inst_*,_false> *)
           ((long)&(this->prog_->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
           + 8))->_M_head_impl;
  uVar15 = pIVar4[(int)i._M_head_impl.len_].out_opcode_;
  iVar11 = (int)local_1f0;
  switch(uVar15 & 7) {
  case 0:
    goto switchD_001cad49_caseD_0;
  case 1:
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar12 = t0;
    uVar13 = 1;
    break;
  case 2:
    uVar13 = c;
    if ((pIVar4[(int)i._M_head_impl.len_].field_1.out1_ & 0x10000) != 0) {
      uVar13 = c | 0x20;
    }
    if (0x19 < c - 0x41U) {
      uVar13 = c;
    }
    if (((int)uVar13 < (int)(uint)pIVar4[(int)i._M_head_impl.len_].field_1.field_3.lo_) ||
       ((int)(uint)pIVar4[(int)i._M_head_impl.len_].field_1.field_3.hi_ < (int)uVar13))
    goto LAB_001cad62;
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar12 = t0;
    uVar1 = pIVar4[(int)i._M_head_impl.len_].field_1.field_3.hint_foldcase_;
    if (uVar1 < 2) goto switchD_001cad49_caseD_7;
    uVar13 = (uint)(uVar1 >> 1);
    break;
  case 3:
    if ((uVar15 & 8) == 0) {
      local_1f0 = (ulong)(iVar11 + 1);
      pAVar2[iVar11].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar11].t = (Thread *)0x0;
    }
    iVar11 = pIVar4[(int)i._M_head_impl.len_].field_1.cap_;
    if (iVar11 < this->ncapture_) {
      pAVar2[(int)local_1f0].id = 0;
      pAVar2[(int)local_1f0].t = t0;
      pTVar8 = this->free_threads_;
      if (pTVar8 == (Thread *)0x0) {
        pTVar8 = (Thread *)operator_new(0x10);
        (pTVar8->field_0).ref = 1;
        uVar15 = this->ncapture_;
        uVar14 = (long)(int)uVar15 * 8;
        if ((long)(int)uVar15 < 0) {
          uVar14 = 0xffffffffffffffff;
        }
        ppcVar9 = (char **)operator_new__(uVar14);
        pTVar8->capture = ppcVar9;
      }
      else {
        this->free_threads_ = (Thread *)pTVar8->field_0;
        (pTVar8->field_0).ref = 1;
        ppcVar9 = pTVar8->capture;
        uVar15 = this->ncapture_;
      }
      if (0 < (int)uVar15) {
        ppcVar5 = t0->capture;
        uVar14 = 0;
        do {
          ppcVar9[uVar14] = ppcVar5[uVar14];
          ppcVar9[uVar14 + 1] = ppcVar5[uVar14 + 1];
          uVar14 = uVar14 + 2;
        } while (uVar14 < uVar15);
        ppcVar9 = pTVar8->capture;
      }
      local_1f0 = (ulong)((int)local_1f0 + 1);
      ppcVar9[iVar11] = p;
      t0 = pTVar8;
    }
    goto LAB_001caec1;
  case 4:
    if ((uVar15 & 8) == 0) {
      local_1f0 = (ulong)(iVar11 + 1);
      pAVar2[iVar11].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar11].t = (Thread *)0x0;
    }
    uVar15 = pIVar4[(int)i._M_head_impl.len_].field_1.out1_;
    uVar7 = Prog::EmptyFlags(context,p);
    if ((uVar15 & ~uVar7) == 0) goto LAB_001caec1;
    goto switchD_001cad49_caseD_7;
  case 5:
    (t0->field_0).ref = (t0->field_0).ref + 1;
    *ppTVar12 = t0;
    uVar15 = pIVar4[(int)i._M_head_impl.len_].out_opcode_;
LAB_001cad62:
    uVar13 = 1;
    if ((uVar15 & 8) != 0) goto switchD_001cad49_caseD_7;
    break;
  case 6:
    if ((uVar15 & 8) == 0) {
      local_1f0 = (ulong)(iVar11 + 1);
      pAVar2[iVar11].id = (int)i._M_head_impl.len_ + 1;
      pAVar2[iVar11].t = (Thread *)0x0;
    }
LAB_001caec1:
    i._M_head_impl.len_ = (Deleter)(pIVar4[(int)i._M_head_impl.len_].out_opcode_ >> 4);
    pTVar8 = (Thread *)0x0;
    goto LAB_001cac8f;
  case 7:
    goto switchD_001cad49_caseD_7;
  }
  i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + uVar13);
  pTVar8 = (Thread *)0x0;
  goto LAB_001cac8f;
switchD_001cad49_caseD_0:
  LogMessage::LogMessage
            (&local_1b0,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
             ,0xf7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10);
  poVar10 = (ostream *)
            std::ostream::operator<<
                      ((ostream *)&local_1b0.str_,pIVar4[(int)i._M_head_impl.len_].out_opcode_ & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," in AddToThreadq",0x10);
  LogMessage::~LogMessage(&local_1b0);
switchD_001cad49_caseD_7:
  if ((int)local_1f0 < 1) {
    return;
  }
  goto LAB_001cac76;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (ExtraDebug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " ! %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}